

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCallSimplifierVisitor.cpp
# Opt level: O2

void __thiscall
IRT::CCallSimplifierVisitor::Visit
          (CCallSimplifierVisitor *this,CJumpConditionalStatement *statement)

{
  CStatement *pCVar1;
  TLogicOperator _operation;
  CExpression *pCVar2;
  CExpression *pCVar3;
  CJumpConditionalStatement *this_00;
  _Head_base<0UL,_const_IRT::CLabelStatement_*,_false> local_60;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_58;
  INode local_50;
  _Alloc_hider local_48;
  INode local_40;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_38;
  
  pCVar2 = CJumpConditionalStatement::LeftOperand(statement);
  (**(pCVar2->super_IExpression).super_INode._vptr_INode)(pCVar2,this);
  pCVar2 = (this->childExpression)._M_t.
           super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  pCVar3 = CJumpConditionalStatement::RightOperand(statement);
  (**(pCVar3->super_IExpression).super_INode._vptr_INode)(pCVar3,this);
  pCVar3 = (this->childExpression)._M_t.
           super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  this_00 = (CJumpConditionalStatement *)operator_new(0x30);
  _operation = CJumpConditionalStatement::Operation(statement);
  local_58._M_head_impl = pCVar3;
  local_38._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
        )(__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
          )pCVar2;
  CJumpConditionalStatement::TrueLabel(statement);
  CLabelStatement::CastCopy((CLabelStatement *)&local_40);
  local_60._M_head_impl = (CLabelStatement *)local_40._vptr_INode;
  local_40._vptr_INode = (_func_int **)0x0;
  CJumpConditionalStatement::FalseLabel(statement);
  CLabelStatement::CastCopy((CLabelStatement *)&local_50);
  local_48._M_p = (pointer)local_50._vptr_INode;
  local_50._vptr_INode = (_func_int **)0x0;
  CJumpConditionalStatement::CJumpConditionalStatement
            (this_00,_operation,&local_38,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_58,
             (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
              *)&local_60,
             (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
              *)&local_48);
  pCVar1 = (this->childStatement)._M_t.
           super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
           .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
  (this->childStatement)._M_t.
  super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
  super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)this_00;
  if (pCVar1 != (CStatement *)0x0) {
    (**(code **)((long)(pCVar1->super_IStatement).super_INode + 0x10))();
  }
  if ((_func_int **)local_48._M_p != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_48._M_p + 0x10))();
  }
  local_48._M_p = (pointer)0x0;
  if (local_50._vptr_INode != (_func_int **)0x0) {
    (**(code **)(*local_50._vptr_INode + 0x10))();
  }
  if (local_60._M_head_impl != (CLabelStatement *)0x0) {
    (*((local_60._M_head_impl)->super_CStatement).super_IStatement.super_INode._vptr_INode[2])();
  }
  local_60._M_head_impl = (CLabelStatement *)0x0;
  if (local_40._vptr_INode != (_func_int **)0x0) {
    (**(code **)(*local_40._vptr_INode + 0x10))();
  }
  if (local_58._M_head_impl != (CExpression *)0x0) {
    (*((local_58._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  local_58._M_head_impl = (CExpression *)0x0;
  if (local_38._M_t.
      super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>.
      _M_t.
      super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
      .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>)0x0) {
    (**(code **)((long)*(IExpression *)
                        local_38._M_t.
                        super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                        .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl + 0x10)
    )();
  }
  return;
}

Assistant:

void IRT::CCallSimplifierVisitor::Visit(const CJumpConditionalStatement &statement) {
    statement.LeftOperand()->Accept(*this);
    std::unique_ptr<const CExpression> left = std::move(childExpression);

    statement.RightOperand()->Accept(*this);
    std::unique_ptr<const CExpression> right = std::move(childExpression);

    childStatement = std::move(
            std::unique_ptr<const CStatement>(
                    new CJumpConditionalStatement(
                            statement.Operation(),
                            std::move(left),
                            std::move(right),
                            std::move(statement.TrueLabel()->CastCopy()),
                            std::move(statement.FalseLabel()->CastCopy())
                    )
            )
    );
}